

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_constant(CompilerGLSL *this,SPIRConstant *constant)

{
  undefined8 ts_1;
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  bool local_183;
  undefined1 local_158 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  undefined1 local_f8 [40];
  string *macro_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  uint32_t local_90;
  uint32_t local_8c;
  uint32_t local_88;
  uint32_t local_84;
  TypedID<(spirv_cross::Types)3> local_80;
  TypedID<(spirv_cross::Types)3> local_7c;
  TypedID<(spirv_cross::Types)3> local_78;
  bool local_71;
  char local_70 [7];
  bool is_workgroup_size_constant;
  TypedID<(spirv_cross::Types)0> local_5c;
  ID workgroup_size_id;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  string name;
  SPIRType *type;
  SPIRConstant *constant_local;
  CompilerGLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(constant->super_IVariant).field_0xc);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(constant->super_IVariant).self);
  (*(this->super_Compiler)._vptr_Compiler[6])(&wg_x,this,(ulong)uVar2,1);
  SpecializationConstant::SpecializationConstant(&wg_y);
  SpecializationConstant::SpecializationConstant(&wg_z);
  SpecializationConstant::SpecializationConstant((SpecializationConstant *)&stack0xffffffffffffffa8)
  ;
  uVar2 = Compiler::get_work_group_size_specialization_constants
                    (&this->super_Compiler,&wg_y,&wg_z,
                     (SpecializationConstant *)&stack0xffffffffffffffa8);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_5c,uVar2);
  bVar1 = TypedID<(spirv_cross::Types)0>::operator==(&(constant->super_IVariant).self,&local_5c);
  if (bVar1) {
    local_70[0] = '\x01';
    local_70[1] = '\0';
    local_70[2] = '\0';
    local_70[3] = '\0';
  }
  else {
    TypedID<(spirv_cross::Types)3>::TypedID(&local_78,&(constant->super_IVariant).self);
    bVar1 = TypedID<(spirv_cross::Types)3>::operator==(&local_78,&wg_y.id);
    local_183 = true;
    if (!bVar1) {
      TypedID<(spirv_cross::Types)3>::TypedID(&local_7c,&(constant->super_IVariant).self);
      bVar1 = TypedID<(spirv_cross::Types)3>::operator==(&local_7c,&wg_z.id);
      local_183 = true;
      if (!bVar1) {
        TypedID<(spirv_cross::Types)3>::TypedID(&local_80,&(constant->super_IVariant).self);
        local_183 = TypedID<(spirv_cross::Types)3>::operator==
                              (&local_80,(TypedID<(spirv_cross::Types)3> *)&stack0xffffffffffffffa8)
        ;
      }
    }
    local_71 = local_183;
    if ((((this->options).vulkan_semantics & 1U) == 0) || (local_183 == false)) {
      if ((((this->options).vulkan_semantics & 1U) == 0) && (local_183 != false)) {
        local_84 = (constant->super_IVariant).self.id;
        bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)local_84,DecorationSpecId);
        if (!bVar1) {
          local_70[0] = '\x01';
          local_70[1] = '\0';
          local_70[2] = '\0';
          local_70[3] = '\0';
          goto LAB_002de029;
        }
      }
      local_88 = (constant->super_IVariant).self.id;
      bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)local_88,DecorationSpecId);
      if (bVar1) {
        if (((this->options).vulkan_semantics & 1U) == 0) {
          local_f8._32_8_ = &constant->specialization_constant_macro_name;
          statement<char_const(&)[9],std::__cxx11::string_const&>
                    (this,(char (*) [9])"#ifndef ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_f8._32_8_);
          ts_1 = local_f8._32_8_;
          constant_expression_abi_cxx11_((CompilerGLSL *)local_f8,(SPIRConstant *)this);
          statement<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
                    (this,(char (*) [9])"#define ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1,
                     (char (*) [2])0x4e078e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
          ::std::__cxx11::string::~string((string *)local_f8);
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
          if ((local_71 & 1U) == 0) {
            (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_118,this,pSVar3,&wg_x,0);
            statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[2]>
                      (this,(char (*) [7])0x4daeb0,local_118,(char (*) [4])0x4f38c2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_f8._32_8_,(char (*) [2])0x4d9ce2);
            ::std::__cxx11::string::~string((string *)local_118);
          }
        }
        else {
          local_90 = (constant->super_IVariant).self.id;
          local_8c = Compiler::get_decoration(&this->super_Compiler,(ID)local_90,DecorationSpecId);
          (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_b0,this,pSVar3,&wg_x,0);
          constant_expression_abi_cxx11_((CompilerGLSL *)&macro_name,(SPIRConstant *)this);
          statement<char_const(&)[22],unsigned_int,char_const(&)[9],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (this,(char (*) [22])"layout(constant_id = ",&local_8c,(char (*) [9])") const ",
                     local_b0,(char (*) [4])0x4f38c2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &macro_name,(char (*) [2])0x4d9ce2);
          ::std::__cxx11::string::~string((string *)&macro_name);
          ::std::__cxx11::string::~string((string *)local_b0);
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_158 + 0x20,this,pSVar3,&wg_x,0);
        constant_expression_abi_cxx11_((CompilerGLSL *)local_158,(SPIRConstant *)this);
        statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (this,(char (*) [7])0x4daeb0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_158 + 0x20),(char (*) [4])0x4f38c2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   (char (*) [2])0x4d9ce2);
        ::std::__cxx11::string::~string((string *)local_158);
        ::std::__cxx11::string::~string((string *)(local_158 + 0x20));
      }
      local_70[0] = '\0';
      local_70[1] = '\0';
      local_70[2] = '\0';
      local_70[3] = '\0';
    }
    else {
      local_70[0] = '\x01';
      local_70[1] = '\0';
      local_70[2] = '\0';
      local_70[3] = '\0';
    }
  }
LAB_002de029:
  ::std::__cxx11::string::~string((string *)&wg_x);
  return;
}

Assistant:

void CompilerGLSL::emit_constant(const SPIRConstant &constant)
{
	auto &type = get<SPIRType>(constant.constant_type);
	auto name = to_name(constant.self);

	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

	// This specialization constant is implicitly declared by emitting layout() in;
	if (constant.self == workgroup_size_id)
		return;

	// These specialization constants are implicitly declared by emitting layout() in;
	// In legacy GLSL, we will still need to emit macros for these, so a layout() in; declaration
	// later can use macro overrides for work group size.
	bool is_workgroup_size_constant = ConstantID(constant.self) == wg_x.id || ConstantID(constant.self) == wg_y.id ||
	                                  ConstantID(constant.self) == wg_z.id;

	if (options.vulkan_semantics && is_workgroup_size_constant)
	{
		// Vulkan GLSL does not need to declare workgroup spec constants explicitly, it is handled in layout().
		return;
	}
	else if (!options.vulkan_semantics && is_workgroup_size_constant &&
	         !has_decoration(constant.self, DecorationSpecId))
	{
		// Only bother declaring a workgroup size if it is actually a specialization constant, because we need macros.
		return;
	}

	// Only scalars have constant IDs.
	if (has_decoration(constant.self, DecorationSpecId))
	{
		if (options.vulkan_semantics)
		{
			statement("layout(constant_id = ", get_decoration(constant.self, DecorationSpecId), ") const ",
			          variable_decl(type, name), " = ", constant_expression(constant), ";");
		}
		else
		{
			const string &macro_name = constant.specialization_constant_macro_name;
			statement("#ifndef ", macro_name);
			statement("#define ", macro_name, " ", constant_expression(constant));
			statement("#endif");

			// For workgroup size constants, only emit the macros.
			if (!is_workgroup_size_constant)
				statement("const ", variable_decl(type, name), " = ", macro_name, ";");
		}
	}
	else
	{
		statement("const ", variable_decl(type, name), " = ", constant_expression(constant), ";");
	}
}